

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O1

string * __thiscall
cs222::Pass2::binaryToHex(string *__return_storage_ptr__,Pass2 *this,string *binaryValue)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  uVar2 = binaryValue->_M_string_length;
  if (uVar2 == 0) {
    iVar4 = 0;
  }
  else {
    uVar1 = 0;
    iVar4 = 0;
    do {
      iVar4 = (uint)((binaryValue->_M_dataplus)._M_p[uVar1] == '1') + iVar4 * 2;
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  std::ostream::operator<<((ostream *)local_190,iVar4);
  std::__cxx11::stringbuf::str();
  uVar2 = (ulong)(int)(uVar2 >> 2);
  lVar3 = uVar2 - __return_storage_ptr__->_M_string_length;
  if (__return_storage_ptr__->_M_string_length <= uVar2 && lVar3 != 0) {
    std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,(char)lVar3);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::binaryToHex(std::string binaryValue)
    {
        int hexLength = binaryValue.length() / 4;
        int result =0 ;
        for(size_t count = 0; count < binaryValue.length() ; ++count)
        {
            result *=2;
            result += binaryValue[count]=='1'? 1 :0;
        }

        std::stringstream ss;
        ss << std::hex  << result;

        std::string hexVal(ss.str());
        if (hexVal.length() < hexLength)
        {
            hexVal.insert(0, hexLength-hexVal.length(), '0');
        }
        return hexVal;
    }